

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

void Inta_ManPrintResolvent(Vec_Int_t *vResLits)

{
  int iVar1;
  uint uVar2;
  int local_14;
  int Entry;
  int i;
  Vec_Int_t *vResLits_local;
  
  printf("Resolvent: {");
  for (local_14 = 0; iVar1 = Vec_IntSize(vResLits), local_14 < iVar1; local_14 = local_14 + 1) {
    uVar2 = Vec_IntEntry(vResLits,local_14);
    printf(" %d",(ulong)uVar2);
  }
  printf(" }\n");
  return;
}

Assistant:

void Inta_ManPrintResolvent( Vec_Int_t * vResLits )
{
    int i, Entry;
    printf( "Resolvent: {" );
    Vec_IntForEachEntry( vResLits, Entry, i )
        printf( " %d", Entry );
    printf( " }\n" );
}